

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsSetPrototype(JsValueRef object,JsValueRef prototypeObject)

{
  anon_class_16_2_52f59fed fn;
  JsErrorCode JVar1;
  JsValueRef local_18;
  JsValueRef prototypeObject_local;
  JsValueRef object_local;
  
  fn.prototypeObject = &local_18;
  fn.object = &prototypeObject_local;
  local_18 = prototypeObject;
  prototypeObject_local = object;
  JVar1 = ContextAPIWrapper<false,JsSetPrototype::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsSetPrototype(_In_ JsValueRef object, _In_ JsValueRef prototypeObject)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTSetPrototype, object, prototypeObject);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_OBJECT_OR_NULL(prototypeObject, scriptContext);

        // We're not allowed to set this.
        if (object == scriptContext->GetLibrary()->GetObjectPrototype())
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptObject::ChangePrototype(Js::VarTo<Js::RecyclableObject>(object), Js::VarTo<Js::RecyclableObject>(prototypeObject), true, scriptContext);

        return JsNoError;
    });
}